

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalNinjaGenerator::WriteTargetAliases(cmGlobalNinjaGenerator *this,ostream *os)

{
  _Base_ptr *config;
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  long *plVar3;
  pointer pbVar4;
  int iVar5;
  iterator iVar6;
  const_iterator cVar7;
  ostream *os_00;
  _Base_ptr p_Var8;
  mapped_type *pmVar9;
  undefined4 extraout_var_00;
  _Rb_tree_node_base *p_Var10;
  undefined4 extraout_var_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  pointer pbVar12;
  pointer pbVar13;
  pointer pbVar14;
  cmNinjaBuild build;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  cmNinjaBuild local_150;
  undefined4 extraout_var;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"# =============================================================================\n",
             0x50);
  std::__ostream_insert<char,std::char_traits<char>>(os,"# Target aliases.\n\n",0x13);
  local_188 = &local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"phony","");
  local_150.Comment._M_dataplus._M_p = (pointer)&local_150.Comment.field_2;
  local_150.Comment._M_string_length = 0;
  local_150.Comment.field_2._M_local_buf[0] = '\0';
  local_150.Rule._M_dataplus._M_p = (pointer)&local_150.Rule.field_2;
  if (local_188 == &local_178) {
    local_150.Rule.field_2._8_8_ = local_178._8_8_;
  }
  else {
    local_150.Rule._M_dataplus._M_p = (pointer)local_188;
  }
  local_150.Rule._M_string_length = local_180;
  local_180 = 0;
  local_178._M_local_buf[0] = '\0';
  p_Var1 = &local_150.Variables._M_t._M_impl.super__Rb_tree_header;
  local_150.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_150.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_188 = &local_178;
  memset(&local_150.Outputs,0,0x90);
  local_150.Variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_150.RspFile._M_dataplus._M_p = (pointer)&local_150.RspFile.field_2;
  local_150.RspFile._M_string_length = 0;
  local_150.RspFile.field_2._M_local_buf[0] = '\0';
  local_150.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_150.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::emplace_back<>(&local_150.Outputs);
  p_Var8 = (this->TargetAliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->TargetAliases)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var1) {
    p_Var2 = &(this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header;
    do {
      if ((*(long *)(p_Var8 + 2) != 0) &&
         (iVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&(this->CustomCommandOutputs)._M_t,(key_type *)(p_Var8 + 1)),
         (_Rb_tree_header *)iVar6._M_node ==
         &(this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header)) {
        std::__cxx11::string::_M_assign
                  ((string *)
                   local_150.Outputs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        pbVar4 = local_150.ExplicitDeps.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar14 = local_150.ExplicitDeps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_150.ExplicitDeps.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_150.ExplicitDeps.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          paVar11 = &(local_150.ExplicitDeps.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_2;
          do {
            plVar3 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (paVar11 + -1))->_M_dataplus)._M_p;
            if (paVar11 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar3) {
              operator_delete(plVar3,paVar11->_M_allocated_capacity + 1);
            }
            pbVar12 = (pointer)(paVar11 + 1);
            paVar11 = paVar11 + 2;
          } while (pbVar12 != pbVar4);
          local_150.ExplicitDeps.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar14;
        }
        config = &p_Var8[2]._M_parent;
        iVar5 = std::__cxx11::string::compare((char *)config);
        if (iVar5 == 0) {
          for (p_Var10 = (this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var10 != p_Var2;
              p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
            AppendTargetOutputs(this,*(cmGeneratorTarget **)(p_Var8 + 2),&local_150.ExplicitDeps,
                                (string *)(p_Var10 + 1),DependOnTargetArtifact);
          }
        }
        else {
          AppendTargetOutputs(this,*(cmGeneratorTarget **)(p_Var8 + 2),&local_150.ExplicitDeps,
                              (string *)config,DependOnTargetArtifact);
        }
        if (((this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
           ((iVar5 = std::__cxx11::string::compare((char *)config), os_00 = os, iVar5 != 0 &&
            (cVar7 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&(this->CrossConfigs)._M_t,(key_type *)config),
            (_Rb_tree_header *)cVar7._M_node == p_Var2)))) {
          iVar5 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                    _vptr_cmGlobalGenerator[0x41])(this,config);
          os_00 = (ostream *)CONCAT44(extraout_var,iVar5);
        }
        WriteBuild(this,os_00,&local_150,0,(bool *)0x0);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var1);
  }
  iVar5 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x26])(this);
  if ((char)iVar5 != '\0') {
    cmMakefile::GetGeneratorConfigs_abi_cxx11_
              (&local_168,
               (cmMakefile *)
               (((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles.
                 super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t,
               IncludeEmptyConfig);
    if (local_168.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_168.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar14 = local_168.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
                 ::operator[](&this->Configs,pbVar14);
        for (p_Var10 = (pmVar9->TargetAliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var10 !=
            &(pmVar9->TargetAliases)._M_t._M_impl.super__Rb_tree_header;
            p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
          if ((*(long *)(p_Var10 + 2) != 0) &&
             (iVar6 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&(this->CustomCommandOutputs)._M_t,(key_type *)(p_Var10 + 1)),
             (_Rb_tree_header *)iVar6._M_node ==
             &(this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header)) {
            std::__cxx11::string::_M_assign
                      ((string *)
                       local_150.Outputs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
            pbVar12 = local_150.ExplicitDeps.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pbVar4 = local_150.ExplicitDeps.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (local_150.ExplicitDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_150.ExplicitDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              paVar11 = &(local_150.ExplicitDeps.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_2;
              do {
                plVar3 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(paVar11 + -1))->_M_dataplus)._M_p;
                if (paVar11 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar3) {
                  operator_delete(plVar3,paVar11->_M_allocated_capacity + 1);
                }
                pbVar13 = (pointer)(paVar11 + 1);
                paVar11 = paVar11 + 2;
              } while (pbVar13 != pbVar12);
              local_150.ExplicitDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
            }
            AppendTargetOutputs(this,*(cmGeneratorTarget **)(p_Var10 + 2),&local_150.ExplicitDeps,
                                pbVar14,DependOnTargetArtifact);
            iVar5 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                      _vptr_cmGlobalGenerator[0x42])(this,pbVar14);
            WriteBuild(this,(ostream *)CONCAT44(extraout_var_00,iVar5),&local_150,0,(bool *)0x0);
          }
        }
        pbVar14 = pbVar14 + 1;
      } while (pbVar14 !=
               local_168.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_168);
    if ((this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      p_Var8 = (this->DefaultTargetAliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(this->DefaultTargetAliases)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var8 != p_Var1) {
        do {
          if ((*(long *)(p_Var8 + 2) != 0) &&
             (iVar6 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&(this->CustomCommandOutputs)._M_t,(key_type *)(p_Var8 + 1)),
             (_Rb_tree_header *)iVar6._M_node ==
             &(this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header)) {
            std::__cxx11::string::_M_assign
                      ((string *)
                       local_150.Outputs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
            pbVar4 = local_150.ExplicitDeps.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pbVar14 = local_150.ExplicitDeps.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_150.ExplicitDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_150.ExplicitDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              paVar11 = &(local_150.ExplicitDeps.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_2;
              do {
                plVar3 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(paVar11 + -1))->_M_dataplus)._M_p;
                if (paVar11 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar3) {
                  operator_delete(plVar3,paVar11->_M_allocated_capacity + 1);
                }
                pbVar12 = (pointer)(paVar11 + 1);
                paVar11 = paVar11 + 2;
              } while (pbVar12 != pbVar4);
              local_150.ExplicitDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar14;
            }
            for (p_Var10 = (this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_left;
                (_Rb_tree_header *)p_Var10 !=
                &(this->DefaultConfigs)._M_t._M_impl.super__Rb_tree_header;
                p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
              AppendTargetOutputs(this,*(cmGeneratorTarget **)(p_Var8 + 2),&local_150.ExplicitDeps,
                                  (string *)(p_Var10 + 1),DependOnTargetArtifact);
            }
            iVar5 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                      _vptr_cmGlobalGenerator[0x43])(this);
            WriteBuild(this,(ostream *)CONCAT44(extraout_var_01,iVar5),&local_150,0,(bool *)0x0);
          }
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        } while ((_Rb_tree_header *)p_Var8 != p_Var1);
      }
    }
  }
  cmNinjaBuild::~cmNinjaBuild(&local_150);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteTargetAliases(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << "# Target aliases.\n\n";

  cmNinjaBuild build("phony");
  build.Outputs.emplace_back();
  for (auto const& ta : this->TargetAliases) {
    // Don't write ambiguous aliases.
    if (!ta.second.GeneratorTarget) {
      continue;
    }

    // Don't write alias if there is a already a custom command with
    // matching output
    if (this->HasCustomCommandOutput(ta.first)) {
      continue;
    }

    build.Outputs.front() = ta.first;
    build.ExplicitDeps.clear();
    if (ta.second.Config == "all") {
      for (auto const& config : this->CrossConfigs) {
        this->AppendTargetOutputs(ta.second.GeneratorTarget,
                                  build.ExplicitDeps, config,
                                  DependOnTargetArtifact);
      }
    } else {
      this->AppendTargetOutputs(ta.second.GeneratorTarget, build.ExplicitDeps,
                                ta.second.Config, DependOnTargetArtifact);
    }
    this->WriteBuild(this->EnableCrossConfigBuild() &&
                         (ta.second.Config == "all" ||
                          this->CrossConfigs.count(ta.second.Config))
                       ? os
                       : *this->GetImplFileStream(ta.second.Config),
                     build);
  }

  if (this->IsMultiConfig()) {
    for (auto const& config : this->Makefiles.front()->GetGeneratorConfigs(
           cmMakefile::IncludeEmptyConfig)) {
      for (auto const& ta : this->Configs[config].TargetAliases) {
        // Don't write ambiguous aliases.
        if (!ta.second.GeneratorTarget) {
          continue;
        }

        // Don't write alias if there is a already a custom command with
        // matching output
        if (this->HasCustomCommandOutput(ta.first)) {
          continue;
        }

        build.Outputs.front() = ta.first;
        build.ExplicitDeps.clear();
        this->AppendTargetOutputs(ta.second.GeneratorTarget,
                                  build.ExplicitDeps, config,
                                  DependOnTargetArtifact);
        this->WriteBuild(*this->GetConfigFileStream(config), build);
      }
    }

    if (!this->DefaultConfigs.empty()) {
      for (auto const& ta : this->DefaultTargetAliases) {
        // Don't write ambiguous aliases.
        if (!ta.second.GeneratorTarget) {
          continue;
        }

        // Don't write alias if there is a already a custom command with
        // matching output
        if (this->HasCustomCommandOutput(ta.first)) {
          continue;
        }

        build.Outputs.front() = ta.first;
        build.ExplicitDeps.clear();
        for (auto const& config : this->DefaultConfigs) {
          this->AppendTargetOutputs(ta.second.GeneratorTarget,
                                    build.ExplicitDeps, config,
                                    DependOnTargetArtifact);
        }
        this->WriteBuild(*this->GetDefaultFileStream(), build);
      }
    }
  }
}